

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

bool djgt_push_image_u8(djg_texture *texture,char *filename,bool flipy)

{
  djg_texture *texture_00;
  stbi_uc *psVar1;
  
  texture_00 = djgt_create(texture->comp);
  texture_00->pf = 1;
  psVar1 = stbi_load(filename,&texture_00->x,&texture_00->y,&texture_00->comp,texture->comp);
  texture_00->texels = (char *)psVar1;
  if (psVar1 == (stbi_uc *)0x0) {
    fwrite("djg_error: Image loading failed\n",0x20,1,_stdout);
    fflush(_stdout);
    fwrite("-- Begin -- STBI Log\n",0x15,1,_stdout);
    fflush(_stdout);
    fprintf(_stdout,"%s\n",stbi__g_failure_reason);
    fflush(_stdout);
    fwrite("-- End -- STBI Log\n",0x13,1,_stdout);
    fflush(_stdout);
    djgt_release(texture_00);
  }
  else {
    djgt__push_texture(texture,texture_00,flipy);
  }
  return psVar1 != (stbi_uc *)0x0;
}

Assistant:

DJGDEF bool
djgt_push_image_u8(djg_texture *texture, const char *filename, bool flipy)
{
    djg_texture *tail = djgt_create(texture->comp);

    tail->pf = DJGT_PF_U8;
    tail->texels = (char *)stbi_load(
        filename, &tail->x, &tail->y, &tail->comp, texture->comp
    );
    if (!tail->texels) {
        DJG_LOG("djg_error: Image loading failed\n");
#ifndef STBI_NO_FAILURE_STRINGS
        DJG_LOG("-- Begin -- STBI Log\n");
        DJG_LOG("%s\n", stbi_failure_reason());
        DJG_LOG("-- End -- STBI Log\n");
#endif // STBI_NO_FAILURE_STRINGS
        djgt_release(tail);

        return false;
    }
    djgt__push_texture(texture, tail, flipy);

    return true;
}